

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

string * __thiscall
mxx::file_block_decompose_abi_cxx11_
          (string *__return_storage_ptr__,mxx *this,char *filename,MPI_Comm comm,
          size_t max_local_size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  pos_type pVar5;
  streampos start;
  int p;
  int rank;
  rangebuf rb;
  stringstream ss;
  ifstream t;
  int local_418;
  int local_414;
  rangebuf local_410;
  stringstream local_3b8 [16];
  undefined1 local_3a8 [112];
  ios_base local_338 [264];
  undefined1 local_230 [16];
  streambuf local_220 [504];
  
  pVar5 = get_filesize((char *)this);
  uVar2 = pVar5._M_off;
  MPI_Comm_size(filename,&local_418,pVar5._M_state);
  MPI_Comm_rank(filename,&local_414);
  if ((comm != (MPI_Comm)0x0) && (comm < (MPI_Comm)(uVar2 / (ulong)(long)local_418))) {
    uVar2 = (long)local_418 * (long)comm;
  }
  uVar4 = (ulong)local_414;
  uVar1 = uVar2 / (ulong)(long)local_418;
  uVar2 = uVar2 % (ulong)(long)local_418;
  uVar3 = uVar2;
  if (uVar4 <= uVar2) {
    uVar3 = uVar4;
  }
  std::ifstream::ifstream(local_230,(char *)this,_S_in);
  start._M_state.__count = 0;
  start._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  start._M_off = uVar4 * uVar1 + uVar3;
  rangebuf::rangebuf(&local_410,start,(uVar4 < uVar2) + uVar1,local_220);
  std::__cxx11::stringstream::stringstream(local_3b8);
  std::ostream::operator<<(local_3a8,&local_410.super_streambuf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_3b8);
  std::ios_base::~ios_base(local_338);
  rangebuf::~rangebuf(&local_410);
  std::ifstream::~ifstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

std::string file_block_decompose(const char* filename, MPI_Comm comm = MPI_COMM_WORLD, std::size_t max_local_size = 0)
{
    // TODO: handle error if file doesn't exist

    // get size of input file
    std::size_t file_size = get_filesize(filename);

    // get communication parameters
    int p, rank;
    MPI_Comm_size(comm, &p);
    MPI_Comm_rank(comm, &rank);

    // restrict max local size (assuming that it is the same parameter on each
    // processor)
    if (max_local_size > 0 && file_size / p > max_local_size)
        file_size = p*max_local_size;
    partition::block_decomposition<std::size_t> part(file_size, p, rank);
    // block decompose
    std::size_t local_size = part.local_size();
    std::size_t offset = part.excl_prefix_size();

    // open file
    std::ifstream t(filename);
    // wrap in our custom range buffer (of type std::streambuf)
    rangebuf rb(offset, local_size, t.rdbuf());

    // read file (range) buffer into string stream
    std::stringstream ss;
    ss << &rb;

    std::string local_str(ss.str());

    return local_str;
}